

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZModule.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  MCRegisterInfo *mri;
  cs_struct *ud_local;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  XCore_init(MRI);
  *(code **)(ctx + 8) = XCore_printInst;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(MCRegisterInfo **)(ctx + 0x20) = MRI;
  *(code **)(ctx + 0x18) = XCore_getInstruction;
  *(code **)(ctx + 0x50) = XCore_post_printer;
  *(code **)(ctx + 0x30) = XCore_reg_name;
  *(code **)(ctx + 0x48) = XCore_get_insn_id;
  *(code **)(ctx + 0x38) = XCore_insn_name;
  *(code **)(ctx + 0x40) = XCore_group_name;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	mri = cs_mem_malloc(sizeof(*mri));

	SystemZ_init(mri);
	ud->printer = SystemZ_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = SystemZ_getInstruction;
	ud->post_printer = SystemZ_post_printer;

	ud->reg_name = SystemZ_reg_name;
	ud->insn_id = SystemZ_get_insn_id;
	ud->insn_name = SystemZ_insn_name;
	ud->group_name = SystemZ_group_name;

	return CS_ERR_OK;
}